

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdAddTxPeginInput(void *handle,void *create_handle,char *txid,uint32_t vout,int64_t amount,
                      char *asset,char *mainchain_genesis_block_hash,char *claim_script,
                      char *mainchain_tx_hex,char *txout_proof)

{
  pointer *ppuVar1;
  size_t sVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  Script local_1d0;
  void *local_198;
  ConfidentialAssetId local_190;
  ConfidentialTransactionContext *local_168;
  int64_t local_160;
  string local_158;
  BlockHash local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  OutPoint outpoint;
  ByteData local_70;
  ByteData local_58;
  Amount local_40;
  
  local_198 = handle;
  local_160 = amount;
  cfd::Initialize();
  ppuVar1 = (pointer *)
            ((long)&local_1d0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_1d0._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"TransactionData","");
  cfd::capi::CheckBuffer(create_handle,(string *)&local_1d0);
  if (local_1d0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_1d0._vptr_Script);
  }
  if (txid == (char *)0x0) {
    local_1d0._vptr_Script = (_func_int **)0x5e1cf2;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb74;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_1d0,kCfdLogLevelWarning,"txid is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d0._vptr_Script = (_func_int **)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,"Failed to parameter. txid is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_1d0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (asset == (char *)0x0) {
    local_1d0._vptr_Script = (_func_int **)0x5e1cf2;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb7a;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_1d0,kCfdLogLevelWarning,"asset is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d0._vptr_Script = (_func_int **)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,"Failed to parameter. asset is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_1d0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (mainchain_genesis_block_hash == (char *)0x0) {
    local_1d0._vptr_Script = (_func_int **)0x5e1cf2;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb80;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_1d0,kCfdLogLevelWarning,
               "mainchain_genesis_block_hash is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d0._vptr_Script =
         (_func_int **)
         ((long)&local_1d0.script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,"Failed to parameter. mainchain_genesis_block_hash is null.","")
    ;
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_1d0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (claim_script == (char *)0x0) {
    local_1d0._vptr_Script = (_func_int **)0x5e1cf2;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb86;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_1d0,kCfdLogLevelWarning,"claim_script is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d0._vptr_Script =
         (_func_int **)
         ((long)&local_1d0.script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,"Failed to parameter. claim_script is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_1d0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (mainchain_tx_hex == (char *)0x0) {
    local_1d0._vptr_Script = (_func_int **)0x5e1cf2;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb8c;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_1d0,kCfdLogLevelWarning,"mainchain_tx_hex is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d0._vptr_Script =
         (_func_int **)
         ((long)&local_1d0.script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,"Failed to parameter. mainchain_tx_hex is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_1d0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (txout_proof == (char *)0x0) {
    local_1d0._vptr_Script = (_func_int **)0x5e1cf2;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb92;
    local_1d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_1d0,kCfdLogLevelWarning,"txout_proof is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d0._vptr_Script =
         (_func_int **)
         ((long)&local_1d0.script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,"Failed to parameter. txout_proof is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_1d0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  local_168 = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
  if (local_168 != (ConfidentialTransactionContext *)0x0) {
    if (is_bitcoin != true) {
      ppuVar1 = (pointer *)
                ((long)&local_190.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 8);
      local_190._vptr_ConfidentialAssetId = (_func_int **)ppuVar1;
      sVar2 = strlen(txid);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,txid,txid + sVar2);
      cfd::core::Txid::Txid((Txid *)&local_1d0,(string *)&local_190);
      cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&local_1d0,vout);
      local_1d0._vptr_Script = (_func_int **)&PTR__Txid_00723450;
      if ((void *)CONCAT44(local_1d0.script_data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_1d0.script_data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_1d0.script_data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_1d0.script_data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      if (local_190._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
        operator_delete(local_190._vptr_ConfidentialAssetId);
      }
      cfd::core::Amount::Amount(&local_40,local_160);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      sVar2 = strlen(asset);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,asset,asset + sVar2);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_190,&local_158);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      sVar2 = strlen(mainchain_genesis_block_hash);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,mainchain_genesis_block_hash,
                 mainchain_genesis_block_hash + sVar2);
      cfd::core::BlockHash::BlockHash(&local_138,&local_b8);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      sVar2 = strlen(claim_script);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,claim_script,claim_script + sVar2);
      cfd::core::Script::Script(&local_1d0,&local_d8);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      sVar2 = strlen(mainchain_tx_hex);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,mainchain_tx_hex,mainchain_tx_hex + sVar2);
      cfd::core::ByteData::ByteData(&local_58,&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      sVar2 = strlen(txout_proof);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,txout_proof,txout_proof + sVar2);
      cfd::core::ByteData::ByteData(&local_70,&local_118);
      cfd::ConfidentialTransactionContext::AddPeginTxIn
                (local_168,&outpoint,&local_40,&local_190,&local_138,&local_1d0,&local_58,&local_70)
      ;
      if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      cfd::core::Script::~Script(&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      local_138._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00723790;
      if (local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      local_190._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
      if (local_190.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      outpoint.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if (outpoint.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(outpoint.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return 0;
    }
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d0._vptr_Script =
         (_func_int **)
         ((long)&local_1d0.script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,"Invalid handle state. tx is bitcoin.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&local_1d0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1d0._vptr_Script =
       (_func_int **)
       ((long)&local_1d0.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&local_1d0);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTxPeginInput(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    int64_t amount, const char* asset,
    const char* mainchain_genesis_block_hash, const char* claim_script,
    const char* mainchain_tx_hex, const char* txout_proof) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (txid == nullptr) {
      warn(CFD_LOG_SOURCE, "txid is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null.");
    }
    if (asset == nullptr) {
      warn(CFD_LOG_SOURCE, "asset is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null.");
    }
    if (mainchain_genesis_block_hash == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_genesis_block_hash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_genesis_block_hash is null.");
    }
    if (claim_script == nullptr) {
      warn(CFD_LOG_SOURCE, "claim_script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. claim_script is null.");
    }
    if (mainchain_tx_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_tx_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_tx_hex is null.");
    }
    if (txout_proof == nullptr) {
      warn(CFD_LOG_SOURCE, "txout_proof is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txout_proof is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    OutPoint outpoint(Txid(txid), vout);
    tx->AddPeginTxIn(
        outpoint, Amount(amount), ConfidentialAssetId(asset),
        BlockHash(mainchain_genesis_block_hash), Script(claim_script),
        ByteData(mainchain_tx_hex), ByteData(txout_proof));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}